

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall
HighsMipSolverData::runPresolve(HighsMipSolverData *this,HighsInt presolve_reduction_limit)

{
  bool bVar1;
  HighsModelStatus HVar2;
  HighsMipSolver *pHVar3;
  HPresolve presolve;
  
  HighsTimer::start(&this->mipsolver->timer_,(this->mipsolver->timer_).presolve_clock);
  ::presolve::HPresolve::HPresolve(&presolve);
  bVar1 = ::presolve::HPresolve::okSetInput(&presolve,this->mipsolver,presolve_reduction_limit);
  if (bVar1) {
    HVar2 = ::presolve::HPresolve::run(&presolve,&this->postSolveStack);
    pHVar3 = this->mipsolver;
    pHVar3->modelstatus_ = HVar2;
  }
  else {
    pHVar3 = this->mipsolver;
    pHVar3->modelstatus_ = kMax;
    presolve.presolve_status_ = kOutOfMemory;
  }
  this->presolve_status = presolve.presolve_status_;
  HighsTimer::stop(&pHVar3->timer_,(pHVar3->timer_).presolve_clock);
  ::presolve::HPresolve::~HPresolve(&presolve);
  return;
}

Assistant:

void HighsMipSolverData::runPresolve(const HighsInt presolve_reduction_limit) {
#ifdef HIGHS_DEBUGSOL
  bool debugSolActive = false;
  std::swap(debugSolution.debugSolActive, debugSolActive);
#endif

  mipsolver.timer_.start(mipsolver.timer_.presolve_clock);
  presolve::HPresolve presolve;
  if (!presolve.okSetInput(mipsolver, presolve_reduction_limit)) {
    mipsolver.modelstatus_ = HighsModelStatus::kMemoryLimit;
    presolve_status = HighsPresolveStatus::kOutOfMemory;
  } else {
    mipsolver.modelstatus_ = presolve.run(postSolveStack);
    presolve_status = presolve.getPresolveStatus();
  }
  mipsolver.timer_.stop(mipsolver.timer_.presolve_clock);

#ifdef HIGHS_DEBUGSOL
  debugSolution.debugSolActive = debugSolActive;
  if (debugSolution.debugSolActive) debugSolution.registerDomain(domain);
  assert(!debugSolution.debugSolActive ||
         checkSolution(debugSolution.debugSolution));
#endif
}